

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugNames::dump(DWARFDebugNames *this,raw_ostream *OS)

{
  NameIndex *NI;
  NameIndex *this_00;
  long lVar1;
  undefined1 local_40 [8];
  ScopedPrinter W;
  
  W.OS._0_4_ = 0;
  W.IndentLevel = 0;
  W._12_4_ = 0;
  W.Prefix.Data = (char *)0x0;
  this_00 = (NameIndex *)
            (this->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
            super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
            super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
            super_SmallVectorBase.BeginX;
  local_40 = (undefined1  [8])OS;
  for (lVar1 = (ulong)(this->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                      super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                      super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                      super_SmallVectorBase.Size * 0x98; lVar1 != 0; lVar1 = lVar1 + -0x98) {
    NameIndex::dump(this_00,(ScopedPrinter *)local_40);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

LLVM_DUMP_METHOD void DWARFDebugNames::dump(raw_ostream &OS) const {
  ScopedPrinter W(OS);
  for (const NameIndex &NI : NameIndices)
    NI.dump(W);
}